

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nn.cpp
# Opt level: O1

void __thiscall
ANN::ANN(ANN *this,ANNpointArray points,int n1,int n2,int size,int dim,int *topology,
        ANNpoint scaling,int NumNeighbors)

{
  int iVar1;
  uint uVar2;
  ANNpoint pAVar3;
  ANNpoint pAVar4;
  ANNpointArray pa;
  ANNidxArray pAVar5;
  ANNdistArray pAVar6;
  int *piVar7;
  ANNkd_tree *this_00;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  
  iVar1 = anncount + 1;
  bVar11 = anncount == 0;
  anncount = iVar1;
  if (bVar11) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"MPNN library",0xc);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\b');
    std::ostream::put('\b');
    std::ostream::flush();
  }
  this->numPoints = size;
  this->dimension = dim;
  pAVar4 = annAllocPt(dim,0.0);
  this->query_pt = pAVar4;
  pa = annAllocPts(this->numPoints,this->dimension);
  this->data_pts = pa;
  uVar10 = (long)NumNeighbors * 4;
  if (NumNeighbors < 0) {
    uVar10 = 0xffffffffffffffff;
  }
  uVar9 = (long)NumNeighbors * 8;
  if (NumNeighbors < 0) {
    uVar9 = 0xffffffffffffffff;
  }
  pAVar5 = (ANNidxArray)operator_new__(uVar10);
  this->nn_idx = pAVar5;
  pAVar6 = (ANNdistArray)operator_new__(uVar9);
  this->dists = pAVar6;
  this->epsilon = 0.0;
  uVar10 = (long)this->numPoints * 4;
  if ((long)this->numPoints < 0) {
    uVar10 = 0xffffffffffffffff;
  }
  piVar7 = (int *)operator_new__(uVar10);
  this->node_indices = piVar7;
  if (n2 - n1 != 0) {
    uVar2 = this->dimension;
    lVar8 = (long)n1;
    uVar10 = 0;
    do {
      piVar7[uVar10] = (int)lVar8;
      if (0 < (int)uVar2) {
        pAVar4 = points[lVar8];
        pAVar3 = pa[uVar10];
        uVar9 = 0;
        do {
          pAVar3[uVar9] = scaling[uVar9] * pAVar4[uVar9];
          uVar9 = uVar9 + 1;
        } while (uVar2 != uVar9);
      }
      uVar10 = uVar10 + 1;
      lVar8 = lVar8 + 1;
    } while (uVar10 != (uint)(n2 - n1));
  }
  this_00 = (ANNkd_tree *)operator_new(0x50);
  ANNkd_tree::ANNkd_tree
            (this_00,pa,this->numPoints,this->dimension,scaling,topology,1,ANN_KD_SUGGEST);
  this->the_tree = this_00;
  return;
}

Assistant:

ANN::ANN(ANNpointArray points, int n1, int n2, int size, int dim, int *topology,
         ANNpoint scaling, int NumNeighbors) {
    int n = 0, i = 0, j = 0;

    anncount++;
    if (anncount == 1) std::cout << "MPNN library" << std::endl;

    numPoints = size;
    dimension = dim;

    query_pt = annAllocPt(dimension);              // allocate query point
    data_pts = annAllocPts(numPoints, dimension);  // allocate data points
    nn_idx = new ANNidx[NumNeighbors];  // allocate near neighbor indices
    dists = new ANNdist[NumNeighbors];  // allocate near neighbor dists
    epsilon = 0.0;

    node_indices = new int[numPoints];  // allocate indices of the points

    // Copy nodes to data_pts
    i = 0;
    for (n = n1; n != n2; n++) {
        node_indices[i] = n;
        for (j = 0; j < dimension; j++) {
            data_pts[i][j] = scaling[j] * points[n][j];
        }
        i++;
    }

    // Initialize ANN
    the_tree = new ANNkd_tree(data_pts,   // the data points
                              numPoints,  // number of points
                              dimension,  // dimension of space
                              scaling,    // scaling of the coordinates
                              topology);  // topology of the space
}